

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall ncnn::YoloDetectionOutput::create_pipeline(YoloDetectionOutput *this,Option *opt)

{
  Layer *pLVar1;
  undefined8 in_RSI;
  ParamDict *in_RDI;
  ParamDict pd;
  undefined8 in_stack_ffffffffffffffc8;
  ParamDict *this_00;
  ParamDict *in_stack_ffffffffffffffe0;
  
  pLVar1 = create_layer_cpu((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  in_RDI[0x12].d = (ParamDictPrivate *)pLVar1;
  this_00 = (ParamDict *)&stack0xffffffffffffffe0;
  ParamDict::ParamDict(in_stack_ffffffffffffffe0);
  ParamDict::set(this_00,0,0);
  (**(code **)(*(long *)(in_RDI[0x12].d)->params + 0x10))(in_RDI[0x12].d,&stack0xffffffffffffffe0);
  (**(code **)(*(long *)(in_RDI[0x12].d)->params + 0x20))(in_RDI[0x12].d,in_RSI);
  ParamDict::~ParamDict(in_RDI);
  return 0;
}

Assistant:

int YoloDetectionOutput::create_pipeline(const Option& opt)
{
    {
        softmax = ncnn::create_layer_cpu(ncnn::LayerType::Softmax);

        ncnn::ParamDict pd;
        pd.set(0, 0); // axis

        softmax->load_param(pd);

        softmax->create_pipeline(opt);
    }

    return 0;
}